

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  HashElement *pHVar1;
  PortInfo *pPVar2;
  int iVar3;
  _List_node_base *p_Var4;
  const_iterator __position;
  uint16_t port_local;
  in6_addr ip_local;
  
  ip_local.__in6_u._8_8_ = ip.__in6_u._8_8_;
  ip_local.__in6_u._0_8_ = ip.__in6_u._0_8_;
  port_local = port;
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::GotoElement(&this->acceptignoreinfo,&ip_local);
  pHVar1 = (this->acceptignoreinfo).curhashelem;
  iVar3 = -0x6f;
  if (pHVar1 != (HashElement *)0x0) {
    pPVar2 = pHVar1->element;
    if (port == 0) {
      pPVar2->all = false;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar2->portlist);
    }
    else {
      this_00 = &pPVar2->portlist;
      p_Var4 = (_List_node_base *)this_00;
      __position._M_node = (_List_node_base *)this_00;
      if (pPVar2->all == false) {
        do {
          __position._M_node = (__position._M_node)->_M_next;
          if (__position._M_node == (_List_node_base *)this_00) {
            return -0x6f;
          }
        } while (*(uint16_t *)&__position._M_node[1]._M_next != port);
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::erase
                  (this_00,__position);
      }
      else {
        while (p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                         &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)this_00) {
          if (*(uint16_t *)&p_Var4[1]._M_next == port) {
            return -0x6f;
          }
        }
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                  (this_00,&port_local);
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}